

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainer.h
# Opt level: O2

void __thiscall
chrono::ChContactContainer::
SumAllContactForces<chrono::ChContactSMC<chrono::ChContactable_3vars<6,6,6>,chrono::ChContactable_3vars<6,6,6>>>
          (ChContactContainer *this,
          list<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
          *contactlist,
          unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
          *contactforces)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  ulong uVar5;
  double dVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long *plVar16;
  key_type pCVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  iterator iVar21;
  _List_node_base *p_Var22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  ChVector<double> force;
  ChVector<double> local_d8;
  undefined1 local_b8 [16];
  double local_a8;
  ulong local_98;
  undefined8 uStack_90;
  double local_88;
  key_type local_80;
  undefined1 local_78 [16];
  undefined8 uStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  ChVector<double> force_loc;
  
  p_Var22 = (_List_node_base *)contactlist;
  while (p_Var22 = (((_List_base<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*,_std::allocator<chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>_*>_>
                      *)&p_Var22->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var22 != (_List_node_base *)contactlist) {
    plVar16 = (long *)p_Var22[1]._M_next;
    local_88 = (double)plVar16[0xe];
    uVar1 = plVar16[0xf];
    uVar2 = plVar16[0xd];
    uVar3 = plVar16[0x10];
    dVar4 = (double)plVar16[0x11];
    uVar5 = plVar16[0x12];
    local_98 = plVar16[0x13];
    dVar6 = (double)plVar16[0x14];
    uVar7 = plVar16[0x15];
    (**(code **)(*plVar16 + 0x10))(&force_loc);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = force_loc.m_data[0];
    auVar34._8_8_ = 0;
    auVar34._0_8_ = force_loc.m_data[2];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar2;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = force_loc.m_data[1] * local_88;
    auVar10 = vfmadd231sd_fma(auVar38,auVar23,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar3;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = force_loc.m_data[1] * dVar4;
    auVar11 = vfmadd231sd_fma(auVar41,auVar23,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_98;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = force_loc.m_data[1] * dVar6;
    auVar12 = vfmadd231sd_fma(auVar29,auVar23,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar1;
    auVar10 = vfmadd231sd_fma(auVar10,auVar34,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar5;
    auVar11 = vfmadd231sd_fma(auVar11,auVar34,auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar7;
    auVar12 = vfmadd231sd_fma(auVar12,auVar34,auVar15);
    dVar37 = auVar10._0_8_;
    dVar40 = auVar11._0_8_;
    dVar28 = auVar12._0_8_;
    lVar20 = (long)p_Var22[1]._M_next;
    dVar4 = *(double *)(lVar20 + 0x38);
    dVar6 = *(double *)(lVar20 + 0x20);
    dVar8 = *(double *)(lVar20 + 0x28);
    dVar9 = *(double *)(lVar20 + 0x30);
    local_98 = *(undefined8 *)(lVar20 + 0x40);
    uStack_90 = *(undefined8 *)(lVar20 + 0x48);
    local_d8.m_data[2] = 0.0;
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = 0.0;
    pCVar17 = *(key_type *)(lVar20 + 0x10);
    force.m_data[0] = dVar37;
    force.m_data[1] = dVar40;
    force.m_data[2] = dVar28;
    if (pCVar17 != (key_type)0x0) {
      lVar20 = __dynamic_cast(pCVar17,&ChContactable_3vars<6,6,6>::typeinfo,&ChBody::typeinfo,
                              0xfffffffffffffffe);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar28;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = dVar40;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = dVar37;
      if (lVar20 != 0) {
        dVar9 = dVar9 - *(double *)(lVar20 + 0x90);
        dVar6 = dVar6 - *(double *)(lVar20 + 0x80);
        dVar8 = dVar8 - *(double *)(lVar20 + 0x88);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar8;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = dVar40 * dVar9;
        auVar10 = vfnmadd231sd_fma(auVar39,auVar30,auVar42);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = dVar9;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = dVar28 * dVar6;
        auVar11 = vfnmadd231sd_fma(auVar43,auVar45,auVar35);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar6;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar37 * dVar8;
        auVar12 = vfnmadd231sd_fma(auVar31,auVar24,auVar47);
        local_d8.m_data[0] = auVar10._0_8_;
        local_d8.m_data[1] = auVar11._0_8_;
        local_d8.m_data[2] = auVar12._0_8_;
      }
    }
    local_80 = pCVar17;
    iVar21 = std::
             _Hashtable<chrono::ChContactable_*,_std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>,_std::__detail::_Select1st,_std::equal_to<chrono::ChContactable_*>,_std::hash<chrono::ChContactable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&contactforces->_M_h,&local_80);
    if (iVar21.
        super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_80 = *(key_type *)((long)p_Var22[1]._M_next + 0x10);
      auVar25._0_8_ = -force.m_data[2];
      auVar25._8_8_ = 0x8000000000000000;
      local_78._8_8_ = -force.m_data[1];
      local_78._0_8_ = -force.m_data[0];
      uStack_68 = vmovlpd_avx(auVar25);
      dStack_60 = local_d8.m_data[0];
      dStack_58 = local_d8.m_data[1];
      dStack_50 = local_d8.m_data[2];
      std::
      _Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<chrono::ChContactable_3vars<6,6,6>*,chrono::ChContactContainer::ForceTorque>>
                ((_Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)contactforces,&local_80);
    }
    else {
      ChVector<double>::operator-=
                ((ChVector<double> *)
                 ((long)iVar21.
                        super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                        ._M_cur + 0x10),&force);
      ChVector<double>::operator+=
                ((ChVector<double> *)
                 ((long)iVar21.
                        super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                        ._M_cur + 0x28),&local_d8);
    }
    local_a8 = 0.0;
    local_b8 = ZEXT816(0);
    pCVar17 = *(key_type *)((long)p_Var22[1]._M_next + 0x18);
    if (pCVar17 != (key_type)0x0) {
      lVar20 = __dynamic_cast(pCVar17,&ChContactable_3vars<6,6,6>::typeinfo,&ChBody::typeinfo,
                              0xfffffffffffffffe);
      if (lVar20 != 0) {
        auVar19._8_8_ = uStack_90;
        auVar19._0_8_ = local_98;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = force.m_data[0];
        auVar46._8_8_ = force.m_data[2];
        auVar46._0_8_ = force.m_data[2];
        auVar18._8_8_ = force.m_data[2];
        auVar18._0_8_ = force.m_data[1];
        auVar11 = vsubpd_avx(auVar19,*(undefined1 (*) [16])(lVar20 + 0x88));
        auVar12 = vunpcklpd_avx(auVar46,auVar32);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar4 - *(double *)(lVar20 + 0x80);
        auVar10 = vshufpd_avx(auVar11,auVar26,1);
        auVar44._0_8_ = force.m_data[1] * auVar10._0_8_;
        auVar44._8_8_ = force.m_data[2] * auVar10._8_8_;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = force.m_data[0] * auVar11._0_8_;
        auVar10 = vfmsub231sd_fma(auVar33,auVar26,auVar18);
        local_b8 = vfmsub213pd_fma(auVar12,auVar11,auVar44);
        local_a8 = auVar10._0_8_;
      }
    }
    local_80 = pCVar17;
    iVar21 = std::
             _Hashtable<chrono::ChContactable_*,_std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>,_std::__detail::_Select1st,_std::equal_to<chrono::ChContactable_*>,_std::hash<chrono::ChContactable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&contactforces->_M_h,&local_80);
    if (iVar21.
        super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
        ._M_cur == (__node_type *)0x0) {
      auVar27._8_8_ = force.m_data[2];
      auVar27._0_8_ = force.m_data[2];
      auVar27._16_8_ = force.m_data[2];
      auVar27._24_8_ = force.m_data[2];
      auVar36._8_8_ = local_b8._0_8_;
      auVar36._0_8_ = local_b8._0_8_;
      auVar36._16_8_ = local_b8._0_8_;
      auVar36._24_8_ = local_b8._0_8_;
      local_80 = *(key_type *)((long)p_Var22[1]._M_next + 0x18);
      auVar27 = vblendpd_avx(ZEXT1632(CONCAT88(force.m_data[1],force.m_data[0])),auVar27,4);
      _local_78 = vblendpd_avx(auVar27,auVar36,8);
      dStack_58 = (double)local_b8._8_8_;
      dStack_50 = local_a8;
      std::
      _Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<std::pair<chrono::ChContactable_3vars<6,6,6>*,chrono::ChContactContainer::ForceTorque>>
                ((_Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)contactforces,&local_80);
    }
    else {
      ChVector<double>::operator+=
                ((ChVector<double> *)
                 ((long)iVar21.
                        super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                        ._M_cur + 0x10),&force);
      ChVector<double>::operator+=
                ((ChVector<double> *)
                 ((long)iVar21.
                        super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                        ._M_cur + 0x28),(ChVector<double> *)local_b8);
    }
  }
  return;
}

Assistant:

void SumAllContactForces(std::list<Tcont*>& contactlist,
                             std::unordered_map<ChContactable*, ForceTorque>& contactforces) {
        for (auto contact = contactlist.begin(); contact != contactlist.end(); ++contact) {
            // Extract information for current contact (expressed in global frame)
            ChMatrix33<> A = (*contact)->GetContactPlane();
            ChVector<> force_loc = (*contact)->GetContactForce();
            ChVector<> force = A * force_loc;
            ChVector<> p1 = (*contact)->GetContactP1();
            ChVector<> p2 = (*contact)->GetContactP2();

            // Calculate contact torque for first object (expressed in global frame).
            // Recall that -force is applied to the first object.
            ChVector<> torque1(0);
            if (ChBody* body = dynamic_cast<ChBody*>((*contact)->GetObjA())) {
                torque1 = Vcross(p1 - body->GetPos(), -force);
            }

            // If there is already an entry for the first object, accumulate.
            // Otherwise, insert a new entry.
            auto entry1 = contactforces.find((*contact)->GetObjA());
            if (entry1 != contactforces.end()) {
                entry1->second.force -= force;
                entry1->second.torque += torque1;
            } else {
                ForceTorque ft{-force, torque1};
                contactforces.insert(std::make_pair((*contact)->GetObjA(), ft));
            }

            // Calculate contact torque for second object (expressed in global frame).
            // Recall that +force is applied to the second object.
            ChVector<> torque2(0);
            if (ChBody* body = dynamic_cast<ChBody*>((*contact)->GetObjB())) {
                torque2 = Vcross(p2 - body->GetPos(), force);
            }

            // If there is already an entry for the first object, accumulate.
            // Otherwise, insert a new entry.
            auto entry2 = contactforces.find((*contact)->GetObjB());
            if (entry2 != contactforces.end()) {
                entry2->second.force += force;
                entry2->second.torque += torque2;
            } else {
                ForceTorque ft{force, torque2};
                contactforces.insert(std::make_pair((*contact)->GetObjB(), ft));
            }
        }
    }